

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSeparateShaderObjsTests.cpp
# Opt level: O3

bool __thiscall
glcts::ProgramUniformCase::setAndCompareMatrixUniforms
          (ProgramUniformCase *this,GLuint pipeline,GLuint programA,GLuint programB,DataType dType,
          int seed)

{
  ostringstream *this_00;
  byte bVar1;
  TestLog *pTVar2;
  GLuint GVar3;
  bool bVar4;
  int iVar5;
  undefined4 uVar6;
  undefined4 extraout_var;
  undefined8 *puVar8;
  long *plVar9;
  long lVar10;
  undefined4 *puVar11;
  TestError *pTVar12;
  ulong *puVar13;
  long *plVar14;
  long lVar15;
  bool bVar16;
  undefined4 *puVar17;
  uint uVar18;
  float *pfVar19;
  ulong uVar20;
  float fVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  GLuint activeProgram;
  GLint locationA [12];
  string uniformBaseName;
  GLint locationB [12];
  float data [104];
  ostringstream s;
  int local_56c;
  long *local_560;
  undefined8 local_558;
  long local_550;
  undefined8 uStack_548;
  ulong *local_540;
  long local_538;
  ulong local_530;
  long lStack_528;
  long *local_520;
  undefined8 local_518;
  long local_510;
  undefined8 uStack_508;
  ulong *local_500;
  long local_4f8;
  ulong local_4f0;
  long lStack_4e8;
  int local_4dc;
  ulong *local_4d8;
  long local_4d0;
  ulong local_4c8;
  long lStack_4c0;
  long *local_4b8;
  long local_4b0;
  long local_4a8;
  long lStack_4a0;
  GLuint local_470;
  int local_46c;
  undefined4 local_468 [4];
  undefined4 local_458;
  undefined4 local_450;
  undefined4 local_448;
  undefined4 local_440;
  ulong *local_438;
  long local_430;
  ulong local_428 [2];
  ulong *local_418;
  long local_410;
  ulong local_408 [2];
  long *local_3f8 [2];
  long local_3e8 [2];
  undefined4 local_3d8 [4];
  undefined4 local_3c8;
  undefined4 local_3c0;
  undefined4 local_3b8;
  undefined4 local_3b0;
  long *local_3a8 [2];
  long local_398 [2];
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  float local_358 [8];
  undefined1 local_338 [16];
  undefined1 local_328 [56];
  undefined1 local_2f0 [8];
  undefined1 local_2e8 [48];
  undefined1 local_2b8 [96];
  undefined1 local_258 [64];
  undefined1 local_218 [92];
  float local_1bc;
  undefined1 local_1b8 [112];
  ios_base local_148 [8];
  ios_base local_140 [272];
  long lVar7;
  
  pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_470 = pipeline;
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar5);
  uStack_370 = 0;
  local_368 = 0;
  uStack_360 = 0;
  local_388 = 0x400000004;
  uStack_380 = 0x900000009;
  local_378 = 0x1000000010;
  local_3f8[0] = local_3e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3f8,"uValM","");
  this_00 = (ostringstream *)(local_1b8 + 8);
  local_1b8._0_8_ = pTVar2;
  std::__cxx11::ostringstream::ostringstream(this_00);
  local_46c = seed;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Begin:ProgramUniformCase for Matrix iterate",0x2b);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  bVar1 = dType < TYPE_DOUBLE & (byte)(0x2220 >> ((byte)dType & 0x1f));
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_140);
  local_56c = 2;
  uVar18 = 0;
  do {
    iVar5 = 2;
    do {
      iVar22 = 0;
      bVar4 = true;
      local_4dc = iVar5;
      do {
        bVar16 = bVar4;
        if ((bVar1 & local_56c == iVar5) == 0) {
          if (local_56c != iVar5 && bVar1 == 0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
            std::ostream::operator<<((ostringstream *)local_1b8,local_56c);
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
            std::ios_base::~ios_base(local_148);
            plVar9 = (long *)std::__cxx11::string::replace
                                       ((ulong)local_3a8,0,(char *)0x0,(ulong)local_3f8[0]);
            local_500 = &local_4f0;
            puVar13 = (ulong *)(plVar9 + 2);
            if ((ulong *)*plVar9 == puVar13) {
              local_4f0 = *puVar13;
              lStack_4e8 = plVar9[3];
            }
            else {
              local_4f0 = *puVar13;
              local_500 = (ulong *)*plVar9;
            }
            local_4f8 = plVar9[1];
            *plVar9 = (long)puVar13;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_500);
            puVar13 = (ulong *)(plVar9 + 2);
            if ((ulong *)*plVar9 == puVar13) {
              local_4c8 = *puVar13;
              lStack_4c0 = plVar9[3];
              local_4d8 = &local_4c8;
            }
            else {
              local_4c8 = *puVar13;
              local_4d8 = (ulong *)*plVar9;
            }
            local_4d0 = plVar9[1];
            *plVar9 = (long)puVar13;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
            std::ostream::operator<<((ostringstream *)local_1b8,local_4dc);
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
            std::ios_base::~ios_base(local_148);
            uVar20 = 0xf;
            if (local_4d8 != &local_4c8) {
              uVar20 = local_4c8;
            }
            if (uVar20 < (ulong)(local_410 + local_4d0)) {
              uVar20 = 0xf;
              if (local_418 != local_408) {
                uVar20 = local_408[0];
              }
              if (uVar20 < (ulong)(local_410 + local_4d0)) goto LAB_00beaaed;
              puVar8 = (undefined8 *)
                       std::__cxx11::string::replace
                                 ((ulong)&local_418,0,(char *)0x0,(ulong)local_4d8);
            }
            else {
LAB_00beaaed:
              puVar8 = (undefined8 *)
                       std::__cxx11::string::_M_append((char *)&local_4d8,(ulong)local_418);
            }
            local_520 = &local_510;
            plVar9 = puVar8 + 2;
            if ((long *)*puVar8 == plVar9) {
              local_510 = *plVar9;
              uStack_508 = puVar8[3];
            }
            else {
              local_510 = *plVar9;
              local_520 = (long *)*puVar8;
            }
            local_518 = puVar8[1];
            *puVar8 = plVar9;
            puVar8[1] = 0;
            *(undefined1 *)plVar9 = 0;
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_520);
            local_540 = &local_530;
            puVar13 = (ulong *)(plVar9 + 2);
            if ((ulong *)*plVar9 == puVar13) {
              local_530 = *puVar13;
              lStack_528 = plVar9[3];
            }
            else {
              local_530 = *puVar13;
              local_540 = (ulong *)*plVar9;
            }
            local_538 = plVar9[1];
            *plVar9 = (long)puVar13;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
            std::ostream::operator<<((ostringstream *)local_1b8,iVar22);
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
            std::ios_base::~ios_base(local_148);
            uVar20 = 0xf;
            if (local_540 != &local_530) {
              uVar20 = local_530;
            }
            if (uVar20 < (ulong)(local_430 + local_538)) {
              uVar20 = 0xf;
              if (local_438 != local_428) {
                uVar20 = local_428[0];
              }
              if (uVar20 < (ulong)(local_430 + local_538)) goto LAB_00beac46;
              puVar8 = (undefined8 *)
                       std::__cxx11::string::replace
                                 ((ulong)&local_438,0,(char *)0x0,(ulong)local_540);
            }
            else {
LAB_00beac46:
              puVar8 = (undefined8 *)
                       std::__cxx11::string::_M_append((char *)&local_540,(ulong)local_438);
            }
            local_560 = &local_550;
            plVar9 = puVar8 + 2;
            if ((long *)*puVar8 == plVar9) {
              local_550 = *plVar9;
              uStack_548 = puVar8[3];
            }
            else {
              local_550 = *plVar9;
              local_560 = (long *)*puVar8;
            }
            local_558 = puVar8[1];
            *puVar8 = plVar9;
            puVar8[1] = 0;
            *(undefined1 *)plVar9 = 0;
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_560);
            local_4b8 = &local_4a8;
            plVar14 = plVar9 + 2;
            if ((long *)*plVar9 == plVar14) {
              local_4a8 = *plVar14;
              lStack_4a0 = plVar9[3];
            }
            else {
              local_4a8 = *plVar14;
              local_4b8 = (long *)*plVar9;
            }
            local_4b0 = plVar9[1];
            *plVar9 = (long)plVar14;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            if (local_560 != &local_550) {
              operator_delete(local_560,local_550 + 1);
            }
            if (local_438 != local_428) {
              operator_delete(local_438,local_428[0] + 1);
            }
            if (local_540 != &local_530) {
              operator_delete(local_540,local_530 + 1);
            }
            if (local_520 != &local_510) {
              operator_delete(local_520,local_510 + 1);
            }
            if (local_418 != local_408) {
              operator_delete(local_418,local_408[0] + 1);
            }
            if (local_4d8 != &local_4c8) {
              operator_delete(local_4d8,local_4c8 + 1);
            }
            if (local_500 != &local_4f0) {
              operator_delete(local_500,local_4f0 + 1);
            }
            if (local_3a8[0] != local_398) {
              operator_delete(local_3a8[0],local_398[0] + 1);
            }
            uVar6 = (**(code **)(lVar7 + 0xb48))(programA,local_4b8);
            local_468[(int)uVar18] = uVar6;
            uVar6 = (**(code **)(lVar7 + 0xb48))(programB,local_4b8);
            goto LAB_00beae4c;
          }
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
          std::ostream::operator<<((ostringstream *)local_1b8,local_56c);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
          std::ios_base::~ios_base(local_148);
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_4d8,0,(char *)0x0,(ulong)local_3f8[0]);
          local_520 = &local_510;
          plVar9 = puVar8 + 2;
          if ((long *)*puVar8 == plVar9) {
            local_510 = *plVar9;
            uStack_508 = puVar8[3];
          }
          else {
            local_510 = *plVar9;
            local_520 = (long *)*puVar8;
          }
          local_518 = puVar8[1];
          *puVar8 = plVar9;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_520);
          local_540 = &local_530;
          puVar13 = (ulong *)(plVar9 + 2);
          if ((ulong *)*plVar9 == puVar13) {
            local_530 = *puVar13;
            lStack_528 = plVar9[3];
          }
          else {
            local_530 = *puVar13;
            local_540 = (ulong *)*plVar9;
          }
          local_538 = plVar9[1];
          *plVar9 = (long)puVar13;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
          std::ostream::operator<<((ostringstream *)local_1b8,iVar22);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
          std::ios_base::~ios_base(local_148);
          uVar20 = 0xf;
          if (local_540 != &local_530) {
            uVar20 = local_530;
          }
          if (uVar20 < (ulong)(local_4f8 + local_538)) {
            uVar20 = 0xf;
            if (local_500 != &local_4f0) {
              uVar20 = local_4f0;
            }
            if (uVar20 < (ulong)(local_4f8 + local_538)) goto LAB_00bea82b;
            puVar8 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_500,0,(char *)0x0,(ulong)local_540)
            ;
          }
          else {
LAB_00bea82b:
            puVar8 = (undefined8 *)
                     std::__cxx11::string::_M_append((char *)&local_540,(ulong)local_500);
          }
          local_560 = &local_550;
          plVar9 = puVar8 + 2;
          if ((long *)*puVar8 == plVar9) {
            local_550 = *plVar9;
            uStack_548 = puVar8[3];
          }
          else {
            local_550 = *plVar9;
            local_560 = (long *)*puVar8;
          }
          local_558 = puVar8[1];
          *puVar8 = plVar9;
          puVar8[1] = 0;
          *(undefined1 *)plVar9 = 0;
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_560);
          local_4b8 = &local_4a8;
          plVar14 = plVar9 + 2;
          if ((long *)*plVar9 == plVar14) {
            local_4a8 = *plVar14;
            lStack_4a0 = plVar9[3];
          }
          else {
            local_4a8 = *plVar14;
            local_4b8 = (long *)*plVar9;
          }
          local_4b0 = plVar9[1];
          *plVar9 = (long)plVar14;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          if (local_560 != &local_550) {
            operator_delete(local_560,local_550 + 1);
          }
          if (local_500 != &local_4f0) {
            operator_delete(local_500,local_4f0 + 1);
          }
          if (local_540 != &local_530) {
            operator_delete(local_540,local_530 + 1);
          }
          if (local_520 != &local_510) {
            operator_delete(local_520,local_510 + 1);
          }
          if (local_4d8 != &local_4c8) {
            operator_delete(local_4d8,local_4c8 + 1);
          }
          uVar6 = (**(code **)(lVar7 + 0xb48))(programA,local_4b8);
          local_468[(int)uVar18] = uVar6;
          uVar6 = (**(code **)(lVar7 + 0xb48))(programB,local_4b8);
LAB_00beae4c:
          local_3d8[(int)uVar18] = uVar6;
          if (local_4b8 != &local_4a8) {
            operator_delete(local_4b8,local_4a8 + 1);
          }
          uVar18 = uVar18 + 1;
        }
        iVar22 = 1;
        bVar4 = false;
      } while (bVar16);
      iVar5 = local_4dc + 1;
    } while (iVar5 != 5);
    local_56c = local_56c + 1;
  } while (local_56c != 5);
  iVar5 = 0;
  iVar22 = 1;
  iVar23 = 2;
  iVar24 = 3;
  lVar10 = 0;
  do {
    local_358[lVar10] = (float)(iVar5 + local_46c);
    local_358[lVar10 + 1] = (float)(iVar22 + local_46c);
    local_358[lVar10 + 2] = (float)(iVar23 + local_46c);
    local_358[lVar10 + 3] = (float)(iVar24 + local_46c);
    lVar10 = lVar10 + 4;
    iVar5 = iVar5 + (int)DAT_01a1fbb0;
    iVar22 = iVar22 + DAT_01a1fbb0._4_4_;
    iVar23 = iVar23 + DAT_01a1fbb0._8_4_;
    iVar24 = iVar24 + DAT_01a1fbb0._12_4_;
  } while (lVar10 != 0x68);
  if (bVar1 == 0) {
    (**(code **)(lVar7 + 0x1178))(programA,local_468[0],2,0,local_358);
    (**(code **)(lVar7 + 0x1188))(programA,local_468[2],2,0,local_328);
    (**(code **)(lVar7 + 0x11a8))(programA,local_458,2,0,local_2e8);
    (**(code **)(lVar7 + 0x11b8))(programA,local_450,2,0,local_2b8);
    (**(code **)(lVar7 + 0x11d8))(programA,local_448,2,0,local_258);
    (**(code **)(lVar7 + 0x11e8))(programA,local_440,2,0,local_218);
    puVar8 = (undefined8 *)&DAT_01af2610;
  }
  else {
    (**(code **)(lVar7 + 0x1168))(programA,local_468[0],2,0,local_358);
    (**(code **)(lVar7 + 0x1198))(programA,local_468[2],2,0,local_338);
    (**(code **)(lVar7 + 0x11c8))(programA,local_458,2,0,local_2f0);
    puVar8 = &local_388;
  }
  if (0 < (int)uVar18) {
    pfVar19 = local_358;
    uVar20 = 0;
    do {
      (**(code **)(lVar7 + 0xb60))(programA,local_468[uVar20],local_1b8);
      (**(code **)(lVar7 + 0xb60))(programB,local_3d8[uVar20],&local_4b8);
      lVar10 = (long)*(int *)((long)puVar8 + uVar20 * 4);
      if (0 < lVar10) {
        lVar15 = 0;
        do {
          fVar21 = *(float *)(local_1b8 + lVar15);
          if ((fVar21 != *(float *)((long)pfVar19 + lVar15)) ||
             (NAN(fVar21) || NAN(*(float *)((long)pfVar19 + lVar15)))) {
LAB_00beb5cd:
            pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar12,"ProgramUniformi failed",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                       ,0x6d8);
            __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
          }
          if ((fVar21 == *(float *)((long)&local_4b8 + lVar15)) &&
             (!NAN(fVar21) && !NAN(*(float *)((long)&local_4b8 + lVar15)))) goto LAB_00beb5cd;
          lVar15 = lVar15 + 4;
        } while (lVar10 * 4 != lVar15);
        pfVar19 = (float *)((long)pfVar19 + lVar15);
      }
      uVar20 = uVar20 + 1;
    } while (uVar20 != uVar18);
  }
  local_358[0] = local_1bc;
  lVar10 = 1;
  fVar21 = local_1bc;
  do {
    fVar21 = fVar21 + 1.0;
    local_358[lVar10] = fVar21;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x68);
  if (bVar1 == 0) {
    (**(code **)(lVar7 + 0x1178))(programB,local_3d8[0],2,0,local_358);
    (**(code **)(lVar7 + 0x1188))(programB,local_3d8[2],2,0,local_328);
    (**(code **)(lVar7 + 0x11a8))(programB,local_3c8,2,0,local_2e8);
    (**(code **)(lVar7 + 0x11b8))(programB,local_3c0,2,0,local_2b8);
    (**(code **)(lVar7 + 0x11d8))(programB,local_3b8,2,0,local_258);
    (**(code **)(lVar7 + 0x11e8))(programB,local_3b0,2,0,local_218);
    puVar8 = (undefined8 *)&DAT_01af2610;
  }
  else {
    (**(code **)(lVar7 + 0x1168))(programB,local_3d8[0],2,0,local_358);
    (**(code **)(lVar7 + 0x1198))(programB,local_3d8[2],2,0,local_338);
    (**(code **)(lVar7 + 0x11c8))(programB,local_3c8,2,0,local_2f0);
    puVar8 = &local_388;
  }
  if (0 < (int)uVar18) {
    pfVar19 = local_358;
    uVar20 = 0;
    do {
      (**(code **)(lVar7 + 0xb60))(programA,local_468[uVar20],local_1b8);
      (**(code **)(lVar7 + 0xb60))(programB,local_3d8[uVar20],&local_4b8);
      lVar10 = (long)*(int *)((long)puVar8 + uVar20 * 4);
      if (0 < lVar10) {
        lVar15 = 0;
        do {
          fVar21 = *(float *)((long)&local_4b8 + lVar15);
          if ((fVar21 != *(float *)((long)pfVar19 + lVar15)) ||
             (NAN(fVar21) || NAN(*(float *)((long)pfVar19 + lVar15)))) {
LAB_00beb613:
            pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar12,"ProgramUniformi failed",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                       ,0x70e);
            __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
          }
          if ((*(float *)(local_1b8 + lVar15) == fVar21) &&
             (!NAN(*(float *)(local_1b8 + lVar15)) && !NAN(fVar21))) goto LAB_00beb613;
          lVar15 = lVar15 + 4;
        } while (lVar10 * 4 != lVar15);
        pfVar19 = (float *)((long)pfVar19 + lVar15);
      }
      uVar20 = uVar20 + 1;
    } while (uVar20 != uVar18);
  }
  local_4b8 = (long *)((ulong)local_4b8 & 0xffffffff00000000);
  if (local_470 != 0) {
    (**(code **)(lVar7 + 0x9a0))(local_470,0x8259,&local_4b8);
    GVar3 = (GLuint)local_4b8;
    if (((GLuint)local_4b8 != 0) && ((GLuint)local_4b8 == programA || (GLuint)local_4b8 == programB)
       ) {
      local_358[0] = local_1bc;
      lVar10 = 1;
      fVar21 = local_1bc;
      do {
        fVar21 = fVar21 + 1.0;
        local_358[lVar10] = fVar21;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 0x68);
      puVar17 = local_3d8;
      if ((GLuint)local_4b8 == programA) {
        puVar17 = local_468;
      }
      if (bVar1 == 0) {
        (**(code **)(lVar7 + 0x15f0))(*puVar17,2,0,local_358);
        puVar11 = local_3d8;
        if (GVar3 == programA) {
          puVar11 = local_468;
        }
        (**(code **)(lVar7 + 0x1600))(puVar11[2],2,0,local_328);
        puVar11 = local_3d8;
        if (GVar3 == programA) {
          puVar11 = local_468;
        }
        (**(code **)(lVar7 + 0x1620))(puVar11[4],2,0,local_2e8);
        puVar11 = local_3d8;
        if (GVar3 == programA) {
          puVar11 = local_468;
        }
        (**(code **)(lVar7 + 0x1630))(puVar11[6],2,0,local_2b8);
        puVar11 = local_3d8;
        if (GVar3 == programA) {
          puVar11 = local_468;
        }
        (**(code **)(lVar7 + 0x1650))(puVar11[8],2,0,local_258);
        puVar11 = local_3d8;
        if (GVar3 == programA) {
          puVar11 = local_468;
        }
        (**(code **)(lVar7 + 0x1660))(puVar11[10],2,0);
        puVar8 = (undefined8 *)&DAT_01af2610;
      }
      else {
        (**(code **)(lVar7 + 0x15e0))(*puVar17,2,0,local_358);
        puVar11 = local_3d8;
        if (GVar3 == programA) {
          puVar11 = local_468;
        }
        (**(code **)(lVar7 + 0x1610))(puVar11[2],2,0,local_338);
        puVar11 = local_3d8;
        if (GVar3 == programA) {
          puVar11 = local_468;
        }
        (**(code **)(lVar7 + 0x1640))(puVar11[4],2,0);
        puVar8 = &local_388;
      }
      if (0 < (int)uVar18) {
        pfVar19 = local_358;
        uVar20 = 0;
        do {
          (**(code **)(lVar7 + 0xb60))((ulong)local_4b8 & 0xffffffff,puVar17[uVar20],local_1b8);
          lVar10 = (long)*(int *)((long)puVar8 + uVar20 * 4);
          if (0 < lVar10) {
            lVar15 = 0;
            do {
              if ((*(float *)(local_1b8 + lVar15) != *(float *)((long)pfVar19 + lVar15)) ||
                 (NAN(*(float *)(local_1b8 + lVar15)) || NAN(*(float *)((long)pfVar19 + lVar15)))) {
                pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
                tcu::TestError::TestError
                          (pTVar12,"ActiveShaderProgram with glUniform failed",(char *)0x0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                           ,0x74e);
                __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
              }
              lVar15 = lVar15 + 4;
            } while (lVar10 * 4 != lVar15);
            pfVar19 = (float *)((long)pfVar19 + lVar15);
          }
          uVar20 = uVar20 + 1;
        } while (uVar20 != uVar18);
      }
    }
  }
  if (local_3f8[0] != local_3e8) {
    operator_delete(local_3f8[0],local_3e8[0] + 1);
  }
  return true;
}

Assistant:

bool setAndCompareMatrixUniforms(glw::GLuint pipeline, glw::GLuint programA, glw::GLuint programB,
									 glu::DataType dType, int seed)
	{
		TestLog&			  log		  = m_testCtx.getLog();
		const glw::Functions& gl		  = m_context.getRenderContext().getFunctions();
		bool				  isSquareMat = isDataTypeSquareMatrix(dType);
		// The matrix versions of the fragment shader have two element arrays
		// of each uniform.
		// There are 3 * 2 uniforms for the square matrix shader and
		// 6 * 2 uniforms in the non-square matrix shader.
		const int  maxUniforms = 12;
		int		   numUniforms;
		const int  arraySize = 2;
		glw::GLint locationA[maxUniforms];
		glw::GLint locationB[maxUniforms];
		// These arrays represent the number of floats for each uniform location
		// 2x2[0], 2x2[1], 3x3[0], 3x3[1], 4x4[0], 4x4[1]
		const int floatCountSqu[maxUniforms] = { 4, 4, 9, 9, 16, 16, 0, 0, 0, 0, 0, 0 };
		// 2x3[0], 2x3[1], 2x4[0], 2x4[1], 3x2[0], 3x2[1], 3x4[0], 3x4[1], 4x2[0]...
		const int  floatCountNonSqu[maxUniforms] = { 6, 6, 8, 8, 6, 6, 12, 12, 8, 8, 12, 12 };
		const int* floatCount;
		// Max data for the uniforms = 2*(2*3 + 3*2 + 2*4 + 4*2 + 3*4 + 4*3)
		const int   maxDataCount = 104;
		float		data[maxDataCount];
		int			i, j, k;
		std::string uniformBaseName("uValM");

		// ProgramUniform API verification
		log << TestLog::Message << "Begin:ProgramUniformCase for Matrix iterate" << TestLog::EndMessage;

		numUniforms = 0;
		// get uniform locations
		for (i = 2; i <= 4; i++) // matrix dimension m
		{
			for (j = 2; j <= 4; j++) // matrix dimension n
			{
				for (k = 0; k < arraySize; k++)
				{
					if ((i == j) && isSquareMat)
					{
						string name			   = uniformBaseName + de::toString(i) + "[" + de::toString(k) + "]";
						locationA[numUniforms] = gl.getUniformLocation(programA, name.c_str());
						locationB[numUniforms] = gl.getUniformLocation(programB, name.c_str());
						numUniforms++;
					}
					else if ((i != j) && !isSquareMat)
					{
						string name =
							uniformBaseName + de::toString(i) + "x" + de::toString(j) + "[" + de::toString(k) + "]";
						locationA[numUniforms] = gl.getUniformLocation(programA, name.c_str());
						locationB[numUniforms] = gl.getUniformLocation(programB, name.c_str());
						numUniforms++;
					}
				}
			}
		}
		DE_ASSERT((numUniforms == 6) || (numUniforms == 12));

		// init the float data array
		for (i = 0; i < maxDataCount; i++)
		{
			data[i] = (float)(seed + i);
		}

		// Set the uniforms in programA
		float* value = &data[0];
		if (isSquareMat)
		{
			floatCount = floatCountSqu;
			gl.programUniformMatrix2fv(programA, locationA[0], arraySize, GL_FALSE, value);
			value += 2 * 2 * arraySize;
			gl.programUniformMatrix3fv(programA, locationA[2], arraySize, GL_FALSE, value);
			value += 3 * 3 * arraySize;
			gl.programUniformMatrix4fv(programA, locationA[4], arraySize, GL_FALSE, value);
		}
		else
		{
			floatCount = floatCountNonSqu;
			gl.programUniformMatrix2x3fv(programA, locationA[0], arraySize, GL_FALSE, value);
			value += 2 * 3 * arraySize;
			gl.programUniformMatrix2x4fv(programA, locationA[2], arraySize, GL_FALSE, value);
			value += 2 * 4 * arraySize;
			gl.programUniformMatrix3x2fv(programA, locationA[4], arraySize, GL_FALSE, value);
			value += 3 * 2 * arraySize;
			gl.programUniformMatrix3x4fv(programA, locationA[6], arraySize, GL_FALSE, value);
			value += 3 * 4 * arraySize;
			gl.programUniformMatrix4x2fv(programA, locationA[8], arraySize, GL_FALSE, value);
			value += 4 * 2 * arraySize;
			gl.programUniformMatrix4x3fv(programA, locationA[10], arraySize, GL_FALSE, value);
		}

		// get and compare the uniform data
		value = &data[0];
		for (i = 0; i < numUniforms; i++)
		{
			float retValA[16], retValB[16];

			gl.getUniformfv(programA, locationA[i], retValA);
			gl.getUniformfv(programB, locationB[i], retValB);

			for (j = 0; j < floatCount[i]; j++)
			{
				// Compare programA uniform to expected value and
				// test to see if programB picked up the value.
				if ((retValA[j] != *value++) || (retValA[j] == retValB[j]))
				{
					TCU_FAIL("ProgramUniformi failed");
				}
			}
		}

		// reseed the float buffer
		data[0] = data[maxDataCount - 1];
		for (i = 1; i < maxDataCount; i++)
		{
			data[i] = data[i - 1] + 1.0f;
		}

		// set uniforms in program B
		value = &data[0];
		if (isSquareMat)
		{
			floatCount = floatCountSqu;
			gl.programUniformMatrix2fv(programB, locationB[0], arraySize, GL_FALSE, value);
			value += 2 * 2 * arraySize;
			gl.programUniformMatrix3fv(programB, locationB[2], arraySize, GL_FALSE, value);
			value += 3 * 3 * arraySize;
			gl.programUniformMatrix4fv(programB, locationB[4], arraySize, GL_FALSE, value);
		}
		else
		{
			floatCount = floatCountNonSqu;
			gl.programUniformMatrix2x3fv(programB, locationB[0], arraySize, GL_FALSE, value);
			value += 2 * 3 * arraySize;
			gl.programUniformMatrix2x4fv(programB, locationB[2], arraySize, GL_FALSE, value);
			value += 2 * 4 * arraySize;
			gl.programUniformMatrix3x2fv(programB, locationB[4], arraySize, GL_FALSE, value);
			value += 3 * 2 * arraySize;
			gl.programUniformMatrix3x4fv(programB, locationB[6], arraySize, GL_FALSE, value);
			value += 3 * 4 * arraySize;
			gl.programUniformMatrix4x2fv(programB, locationB[8], arraySize, GL_FALSE, value);
			value += 4 * 2 * arraySize;
			gl.programUniformMatrix4x3fv(programB, locationB[10], arraySize, GL_FALSE, value);
		}

		// get and compare the uniform data
		value = &data[0];
		for (i = 0; i < numUniforms; i++)
		{
			float retValA[16], retValB[16];

			gl.getUniformfv(programA, locationA[i], retValA);
			gl.getUniformfv(programB, locationB[i], retValB);

			for (j = 0; j < floatCount[i]; j++)
			{
				// Compare programB uniform to expected value and
				// test to see if programA picked up the value.
				if ((retValB[j] != *value++) || (retValA[j] == retValB[j]))
				{
					TCU_FAIL("ProgramUniformi failed");
				}
			}
		}

		// Use the conventional uniform interfaces on an ACTIVE_PROGRAM
		glw::GLuint activeProgram = 0;
		if (pipeline != 0)
		{
			gl.getProgramPipelineiv(pipeline, GL_ACTIVE_PROGRAM, (int*)&activeProgram);
		}
		if ((activeProgram != 0) && ((activeProgram == programA) || (activeProgram == programB)))
		{
			glw::GLint* location;

			location = (activeProgram == programA) ? locationA : locationB;

			// reseed the float buffer
			data[0] = data[maxDataCount - 1];
			for (i = 1; i < maxDataCount; i++)
			{
				data[i] = data[i - 1] + 1.0f;
			}

			// set uniforms with conventional uniform calls
			value = &data[0];
			if (isSquareMat)
			{
				floatCount = floatCountSqu;
				gl.uniformMatrix2fv(location[0], arraySize, GL_FALSE, value);
				value += 2 * 2 * arraySize;
				gl.uniformMatrix3fv(location[2], arraySize, GL_FALSE, value);
				value += 3 * 3 * arraySize;
				gl.uniformMatrix4fv(location[4], arraySize, GL_FALSE, value);
			}
			else
			{
				floatCount = floatCountNonSqu;
				gl.uniformMatrix2x3fv(location[0], arraySize, GL_FALSE, value);
				value += 2 * 3 * arraySize;
				gl.uniformMatrix2x4fv(location[2], arraySize, GL_FALSE, value);
				value += 2 * 4 * arraySize;
				gl.uniformMatrix3x2fv(location[4], arraySize, GL_FALSE, value);
				value += 3 * 2 * arraySize;
				gl.uniformMatrix3x4fv(location[6], arraySize, GL_FALSE, value);
				value += 3 * 4 * arraySize;
				gl.uniformMatrix4x2fv(location[8], arraySize, GL_FALSE, value);
				value += 4 * 2 * arraySize;
				gl.uniformMatrix4x3fv(location[10], arraySize, GL_FALSE, value);
			}

			// get and compare the uniform data
			value = &data[0];
			for (i = 0; i < numUniforms; i++)
			{
				float retVal[16];

				gl.getUniformfv(activeProgram, location[i], retVal);

				for (j = 0; j < floatCount[i]; j++)
				{
					// Compare activeshaderprogram uniform to expected value
					if (retVal[j] != *value++)
					{
						TCU_FAIL("ActiveShaderProgram with glUniform failed");
					}
				}
			}
		}

		return true;
	}